

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::NegativeInfinity(Value *__return_storage_ptr__,LogicalType *type)

{
  InvalidTypeException *this;
  string local_40;
  
  switch(type->id_) {
  case DATE:
    DATE(__return_storage_ptr__,(date_t)0x80000001);
    break;
  default:
    this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"NegativeInfinity requires numeric type","");
    InvalidTypeException::InvalidTypeException(this,type,&local_40);
    __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    TIMESTAMPSEC(__return_storage_ptr__,(timestamp_sec_t)0x8000000000000001);
    break;
  case TIMESTAMP_MS:
    TIMESTAMPMS(__return_storage_ptr__,(timestamp_ms_t)0x8000000000000001);
    break;
  case TIMESTAMP:
    TIMESTAMP(__return_storage_ptr__,(timestamp_t)0x8000000000000001);
    break;
  case TIMESTAMP_NS:
    TIMESTAMPNS(__return_storage_ptr__,(timestamp_ns_t)0x8000000000000001);
    break;
  case FLOAT:
    FLOAT(__return_storage_ptr__,-INFINITY);
    break;
  case DOUBLE:
    DOUBLE(__return_storage_ptr__,-INFINITY);
    break;
  case TIMESTAMP_TZ:
    TIMESTAMPTZ(__return_storage_ptr__,(timestamp_tz_t)0x8000000000000001);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::NegativeInfinity(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::DATE:
		return Value::DATE(date_t::ninfinity());
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(timestamp_t::ninfinity());
	case LogicalTypeId::TIMESTAMP_SEC:
		return Value::TIMESTAMPSEC(timestamp_sec_t(timestamp_t::ninfinity().value));
	case LogicalTypeId::TIMESTAMP_MS:
		return Value::TIMESTAMPMS(timestamp_ms_t(timestamp_t::ninfinity().value));
	case LogicalTypeId::TIMESTAMP_NS:
		return Value::TIMESTAMPNS(timestamp_ns_t(timestamp_t::ninfinity().value));
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::ninfinity()));
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(-std::numeric_limits<float>::infinity());
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(-std::numeric_limits<double>::infinity());
	default:
		throw InvalidTypeException(type, "NegativeInfinity requires numeric type");
	}
}